

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

string * __thiscall
cmCMakeHostSystemInformationCommand::ValueToString
          (string *__return_storage_ptr__,cmCMakeHostSystemInformationCommand *this,string *value)

{
  string *value_local;
  cmCMakeHostSystemInformationCommand *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakeHostSystemInformationCommand::ValueToString(
  std::string const& value) const
{
  return value;
}